

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

char * Strsafe(char *y)

{
  uint uVar1;
  char cVar2;
  char *__s;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char *extraout_RAX;
  char *extraout_RAX_00;
  uint *in_RCX;
  long extraout_RDX;
  uint uVar6;
  long in_RSI;
  FILE *__stream;
  
  if (y == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = Strsafe_find(y);
    if (pcVar3 == (char *)0x0) {
      sVar4 = strlen(y);
      __stream = (FILE *)(long)((int)sVar4 + 1);
      pcVar3 = (char *)malloc((size_t)__stream);
      if (pcVar3 == (char *)0x0) {
        Strsafe_cold_1();
        pcVar3 = extraout_RAX;
        if ((*(char **)(in_RSI + 0x40) != (char *)0x0) && (**(char **)(in_RSI + 0x40) != '\0')) {
          fprintf(__stream,"{%s");
          pcVar3 = *(char **)(in_RSI + 0x40);
          do {
            if (*pcVar3 == '\n') {
              *in_RCX = *in_RCX + 1;
            }
            else if (*pcVar3 == '\0') break;
            pcVar3 = pcVar3 + 1;
          } while( true );
        }
        lVar5 = *(long *)(in_RSI + 0x38);
        if (lVar5 != 0) {
          if (*(int *)(extraout_RDX + 0x114) == 0) {
            *in_RCX = *in_RCX + 1;
            tplt_linedir((FILE *)__stream,*(int *)(in_RSI + 0x30),*(char **)(extraout_RDX + 0xe0));
            lVar5 = *(long *)(in_RSI + 0x38);
          }
          fprintf(__stream,"{%s",lVar5);
          pcVar3 = *(char **)(in_RSI + 0x38);
          do {
            if (*pcVar3 == '\n') {
              *in_RCX = *in_RCX + 1;
            }
            else if (*pcVar3 == '\0') goto LAB_0010bb62;
            pcVar3 = pcVar3 + 1;
          } while( true );
        }
        goto LAB_0010bba2;
      }
      lVar5 = 0;
      do {
        cVar2 = y[lVar5];
        pcVar3[lVar5] = cVar2;
        lVar5 = lVar5 + 1;
      } while (cVar2 != '\0');
      Strsafe_insert(pcVar3);
    }
  }
  return pcVar3;
LAB_0010bb62:
  fwrite("}\n",2,1,__stream);
  uVar6 = *in_RCX;
  uVar1 = uVar6 + 1;
  pcVar3 = (char *)(ulong)uVar1;
  *in_RCX = uVar1;
  if (*(int *)(extraout_RDX + 0x114) == 0) {
    uVar6 = uVar6 + 2;
    *in_RCX = uVar6;
    tplt_linedir((FILE *)__stream,uVar6,*(char **)(extraout_RDX + 0xe8));
    pcVar3 = extraout_RAX_00;
  }
LAB_0010bba2:
  __s = *(char **)(in_RSI + 0x48);
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    fputs(__s,__stream);
    pcVar3 = *(char **)(in_RSI + 0x48);
    do {
      if (*pcVar3 == '\n') {
        *in_RCX = *in_RCX + 1;
      }
      else if (*pcVar3 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  if (*(long *)(in_RSI + 0x40) != 0) {
    pcVar3 = (char *)fwrite("}\n",2,1,__stream);
    *in_RCX = *in_RCX + 1;
  }
  return pcVar3;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    lemon_strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}